

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::bson::
basic_bson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::read_string(basic_bson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
              *this,string_type *buffer,error_code *ec)

{
  type_conflict tVar1;
  type_conflict2 tVar2;
  reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_> *this_00;
  error_code *in_RDI;
  uint8_t c;
  size_t size;
  type_conflict len;
  size_t n;
  uint8_t buf [4];
  vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
  *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  bson_errc bVar5;
  size_t in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  value_type *in_stack_ffffffffffffffd8;
  type_conflict2 tVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data;
  vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_> *pvVar7;
  binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  bVar5 = (bson_errc)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  tVar2 = binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::read<std::random_access_iterator_tag>
                    (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  tVar6 = tVar2;
  pvVar3 = std::vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::
           back(in_stack_ffffffffffffffa0);
  pvVar3->pos = tVar2 + pvVar3->pos;
  if (tVar6 == 4) {
    tVar1 = binary::little_to_native<int,jsoncons::detail::endian>(&stack0xffffffffffffffe4,4);
    if (tVar1 < 1) {
      std::error_code::operator=(in_RDI,bVar5);
      *(undefined1 *)&in_RDI->_M_cat = 0;
    }
    else {
      v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((long)tVar1 + -1);
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               source_reader<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
               ::read<std::__cxx11::string>
                         ((binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)CONCAT44(tVar1,in_stack_ffffffffffffffd0),v,in_stack_ffffffffffffffc0);
      data = pbVar4;
      pvVar3 = std::
               vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::
               back(in_stack_ffffffffffffffa0);
      pvVar3->pos = (size_t)(&pbVar4->_M_dataplus + pvVar3->pos);
      if (data == v) {
        this_00 = (vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                   *)binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::read<std::random_access_iterator_tag>
                               (in_stack_ffffffffffffffe0,(value_type *)data,
                                CONCAT44(tVar1,in_stack_ffffffffffffffd0));
        bVar5 = (bson_errc)((ulong)pbVar4 >> 0x20);
        pvVar7 = this_00;
        pvVar3 = std::
                 vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::
                 back(this_00);
        pvVar3->pos = (long)&(this_00->
                             super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                             )._M_impl.super__Vector_impl_data._M_start + pvVar3->pos;
        if (pvVar7 != (vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                       *)0x1) {
          std::error_code::operator=(in_RDI,bVar5);
          *(undefined1 *)&in_RDI->_M_cat = 0;
        }
      }
      else {
        std::error_code::operator=(in_RDI,(bson_errc)((ulong)pbVar4 >> 0x20));
        *(undefined1 *)&in_RDI->_M_cat = 0;
      }
    }
  }
  else {
    std::error_code::operator=(in_RDI,bVar5);
    *(undefined1 *)&in_RDI->_M_cat = 0;
  }
  return;
}

Assistant:

void read_string(string_type& buffer, std::error_code& ec)
    {
        uint8_t buf[sizeof(int32_t)]; 
        std::size_t n = source_.read(buf, sizeof(int32_t));
        state_stack_.back().pos += n;
        if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
        {
            ec = bson_errc::unexpected_eof;
            more_ = false;
            return;
        }
        auto len = binary::little_to_native<int32_t>(buf, sizeof(buf));
        if (JSONCONS_UNLIKELY(len < 1))
        {
            ec = bson_errc::string_length_is_non_positive;
            more_ = false;
            return;
        }

        std::size_t size = static_cast<std::size_t>(len) - static_cast<std::size_t>(1);
        n = source_reader<Source>::read(source_, buffer, size);
        state_stack_.back().pos += n;

        if (JSONCONS_UNLIKELY(n != size))
        {
            ec = bson_errc::unexpected_eof;
            more_ = false;
            return;
        }
        uint8_t c;
        n = source_.read(&c, 1);
        state_stack_.back().pos += n;
        if (JSONCONS_UNLIKELY(n != 1))
        {
            ec = bson_errc::unexpected_eof;
            more_ = false;
            return;
        }
    }